

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O1

void __thiscall
CsSignal::SignalBase::addConnection
          (SignalBase *this,
          unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
          *signalMethod,SlotBase *receiver,
          unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
          *slotMethod,ConnectionKind type,write_handle *senderListHandle)

{
  tuple<const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  tVar1;
  tuple<const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  tVar2;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *prVar3;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *prVar4;
  __pointer_type pnVar5;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *prVar6;
  pointer *__ptr;
  write_handle receiverListHandle;
  ConnectStruct local_70;
  write_handle local_50;
  
  tVar1.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
        )(signalMethod->_M_t).
         super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
         .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl;
  (signalMethod->_M_t).
  super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (BentoAbstract *)0x0;
  tVar2.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
        )(slotMethod->_M_t).
         super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
         .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl;
  (slotMethod->_M_t).
  super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (BentoAbstract *)0x0;
  if (senderListHandle->m_accessed == false) {
    libguarded::
    rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
    ::rcu_guard::rcu_write_lock(&senderListHandle->m_guard,senderListHandle->m_ptr);
    senderListHandle->m_accessed = true;
  }
  local_70.signalMethod._M_t.
  super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>,_true,_true>
        )(__uniq_ptr_data<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>,_true,_true>
          )tVar1.
           super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
           .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl;
  local_70.receiver = receiver;
  local_70.slotMethod._M_t.
  super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>,_true,_true>
        )(__uniq_ptr_data<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>,_true,_true>
          )tVar2.
           super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
           .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl;
  local_70.type = type;
  libguarded::
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  ::push_back(senderListHandle->m_ptr,&local_70);
  if ((_Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
       )local_70.slotMethod._M_t.
        super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
        .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl !=
      (BentoAbstract *)0x0) {
    (**(code **)(*(long *)local_70.slotMethod._M_t.
                          super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
                          .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>.
                          _M_head_impl + 8))();
  }
  local_70.slotMethod._M_t.
  super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>,_true,_true>
        )(__uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
          )0x0;
  if ((_Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>)
      local_70.signalMethod._M_t.
      super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
      .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl !=
      (_Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>)0x0) {
    (**(code **)(*(long *)local_70.signalMethod._M_t.
                          super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
                          .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>.
                          _M_head_impl + 8))();
  }
  local_70.signalMethod._M_t.
  super___uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_CsSignal::Internal::BentoAbstract_*,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
  .super__Head_base<0UL,_const_CsSignal::Internal::BentoAbstract_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>,_true,_true>
        )(__uniq_ptr_impl<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
          )0x0;
  if (receiver != (SlotBase *)0x0) {
    local_50.m_ptr = &(receiver->m_possibleSenders).m_obj;
    local_50.m_accessed = false;
    libguarded::
    rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
    ::rcu_guard::rcu_write_lock(&local_50.m_guard,local_50.m_ptr);
    prVar4 = local_50.m_ptr;
    local_50.m_accessed = true;
    pnVar5 = (__pointer_type)operator_new(0x20);
    (pnVar5->next)._M_b._M_p = (__pointer_type)0x0;
    (pnVar5->back)._M_b._M_p = (__pointer_type)0x0;
    pnVar5->deleted = false;
    pnVar5->data = this;
    prVar3 = (rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
              *)(prVar4->m_tail)._M_b._M_p;
    prVar6 = prVar4;
    if (prVar3 != (rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
                   *)0x0) {
      LOCK();
      (pnVar5->back)._M_b._M_p = (__pointer_type)prVar3;
      UNLOCK();
      prVar6 = prVar3;
    }
    LOCK();
    (((rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
       *)&prVar6->m_head)->m_head)._M_b._M_p = pnVar5;
    UNLOCK();
    LOCK();
    (prVar4->m_tail)._M_b._M_p = pnVar5;
    UNLOCK();
    libguarded::
    rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
    ::write_handle::~write_handle(&local_50);
  }
  return;
}

Assistant:

void CsSignal::SignalBase::addConnection(std::unique_ptr<const Internal::BentoAbstract> signalMethod, const SlotBase *receiver,
                  std::unique_ptr<const Internal::BentoAbstract> slotMethod, ConnectionKind type,
                  libguarded::SharedList<ConnectStruct>::write_handle &senderListHandle) const
{
   struct ConnectStruct tempStruct;

   tempStruct.signalMethod = std::move(signalMethod);
   tempStruct.receiver     = receiver;
   tempStruct.slotMethod   = std::move(slotMethod);
   tempStruct.type         = type;

   senderListHandle->push_back(std::move(tempStruct));

   // broom - senderListHandle->unlock()

   if (receiver != nullptr)  {
      auto receiverListHandle = receiver->m_possibleSenders.lock_write();
      receiverListHandle->push_back(this);
   }
}